

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O3

FunctionData * __thiscall
inja::FunctionStorage::get_or_new(FunctionStorage *this,string_view name,uint num_args)

{
  iterator __position;
  FunctionData *i;
  mapped_type *this_00;
  FunctionData *pFVar1;
  pointer pFVar2;
  mapped_type *__range2;
  key_type local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,name.data_,name.data_ + name.size_);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<inja::FunctionStorage::FunctionData,_std::allocator<inja::FunctionStorage::FunctionData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<inja::FunctionStorage::FunctionData,_std::allocator<inja::FunctionStorage::FunctionData>_>_>_>_>
            ::operator[](&this->m_map,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  pFVar1 = (this_00->
           super__Vector_base<inja::FunctionStorage::FunctionData,_std::allocator<inja::FunctionStorage::FunctionData>_>
           )._M_impl.super__Vector_impl_data._M_start;
  __position._M_current =
       (this_00->
       super__Vector_base<inja::FunctionStorage::FunctionData,_std::allocator<inja::FunctionStorage::FunctionData>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (pFVar1 == __position._M_current) {
      if (__position._M_current ==
          (this_00->
          super__Vector_base<inja::FunctionStorage::FunctionData,_std::allocator<inja::FunctionStorage::FunctionData>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<inja::FunctionStorage::FunctionData,_std::allocator<inja::FunctionStorage::FunctionData>_>
        ::_M_realloc_insert<>(this_00,__position);
        pFVar2 = (this_00->
                 super__Vector_base<inja::FunctionStorage::FunctionData,_std::allocator<inja::FunctionStorage::FunctionData>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        *(undefined8 *)
         ((long)&((__position._M_current)->function).super__Function_base._M_functor + 8) = 0;
        ((__position._M_current)->function).super__Function_base._M_manager = (_Manager_type)0x0;
        (__position._M_current)->num_args = 0;
        (__position._M_current)->op = Nop;
        *(undefined3 *)&(__position._M_current)->field_0x5 = 0;
        *(undefined8 *)&((__position._M_current)->function).super__Function_base._M_functor = 0;
        ((__position._M_current)->function)._M_invoker = (_Invoker_type)0x0;
        pFVar2 = (this_00->
                 super__Vector_base<inja::FunctionStorage::FunctionData,_std::allocator<inja::FunctionStorage::FunctionData>_>
                 )._M_impl.super__Vector_impl_data._M_finish + 1;
        (this_00->
        super__Vector_base<inja::FunctionStorage::FunctionData,_std::allocator<inja::FunctionStorage::FunctionData>_>
        )._M_impl.super__Vector_impl_data._M_finish = pFVar2;
      }
      pFVar2[-1].num_args = num_args;
      return pFVar2 + -1;
    }
    if (pFVar1->num_args == num_args) break;
    pFVar1 = pFVar1 + 1;
  }
  return pFVar1;
}

Assistant:

FunctionData& get_or_new(nonstd::string_view name, unsigned int num_args) {
		auto& vec = m_map[static_cast<std::string>(name)];
		for (auto& i : vec) {
			if (i.num_args == num_args) return i;
		}
		vec.emplace_back();
		vec.back().num_args = num_args;
		return vec.back();
	}